

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

Vec_Wec_t * Mop_ManCubeCount(Mop_Man_t *p)

{
  ulong uVar1;
  int Entry;
  word *pwVar2;
  bool bVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *__ptr;
  long lVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  uVar13 = p->nOuts;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar13 - 1) {
    uVar12 = uVar13;
  }
  pVVar4->nCap = uVar12;
  if (uVar12 == 0) {
    __ptr = (Vec_Int_t *)0x0;
  }
  else {
    __ptr = (Vec_Int_t *)calloc((long)(int)uVar12,0x10);
  }
  pVVar4->pArray = __ptr;
  pVVar4->nSize = uVar13;
  pVVar6 = p->vCubes;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    uVar9 = uVar13;
    do {
      Entry = pVVar6->pArray[lVar11];
      if (Entry != -1) {
        uVar7 = p->nWordsOut * Entry;
        if (((int)uVar7 < 0) || (p->vWordsOut->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < (int)uVar13) {
          pwVar2 = p->vWordsOut->pArray;
          lVar8 = 0;
          lVar10 = 1;
          do {
            uVar1 = lVar10 - 1;
            if ((pwVar2[(ulong)uVar7 + (uVar1 >> 6 & 0x3ffffff)] >> (uVar1 & 0x3f) & 1) != 0) {
              lVar5 = (long)(int)uVar9;
              if ((long)(int)uVar9 <= (long)uVar1) {
                uVar13 = uVar9 * 2;
                uVar9 = (uint)lVar10;
                if ((int)uVar13 <= (int)uVar9) {
                  uVar13 = uVar9;
                }
                if (uVar13 - uVar12 != 0 && (int)uVar12 <= (int)uVar13) {
                  if (__ptr == (Vec_Int_t *)0x0) {
                    __ptr = (Vec_Int_t *)malloc((ulong)uVar13 << 4);
                  }
                  else {
                    __ptr = (Vec_Int_t *)realloc(__ptr,(ulong)uVar13 << 4);
                  }
                  pVVar4->pArray = __ptr;
                  memset(__ptr + (int)uVar12,0,(long)(int)(uVar13 - uVar12) << 4);
                  pVVar4->nCap = uVar13;
                  uVar12 = uVar13;
                }
                pVVar4->nSize = uVar9;
                lVar5 = lVar10;
              }
              if (lVar5 <= (long)uVar1) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                              ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
              }
              Vec_IntPush((Vec_Int_t *)((long)&__ptr->nCap + lVar8),Entry);
              uVar13 = p->nOuts;
            }
            lVar8 = lVar8 + 0x10;
            bVar3 = lVar10 < (int)uVar13;
            lVar10 = lVar10 + 1;
          } while (bVar3);
          pVVar6 = p->vCubes;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar6->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Wec_t * Mop_ManCubeCount( Mop_Man_t * p )
{
    int i, k, iCube;
    Vec_Wec_t * vOuts = Vec_WecStart( p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    if ( iCube != -1 )
    {
        word * pCube = Mop_ManCubeOut( p, iCube );
        for ( k = 0; k < p->nOuts; k++ )
            if ( Abc_TtGetBit( pCube, k ) )
                Vec_WecPush( vOuts, k, iCube );
    }
    return vOuts;
}